

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generateList.hpp
# Opt level: O3

vector<double,_std::allocator<double>_> *
njoy::ENDFtk::section::Type<2,_151>::
LJValueType<njoy::ENDFtk::section::Type<2,_151>::UnresolvedEnergyDependent,_void>::JValue::
generateList(vector<double,_std::allocator<double>_> *__return_storage_ptr__,int amux,int amun,
            int amug,int amuf,vector<double,_std::allocator<double>_> *energies,
            vector<double,_std::allocator<double>_> *d,vector<double,_std::allocator<double>_> *gx,
            vector<double,_std::allocator<double>_> *gn,vector<double,_std::allocator<double>_> *gg,
            vector<double,_std::allocator<double>_> *gf)

{
  long lVar1;
  double *pdVar2;
  undefined8 *puVar3;
  double *pdVar4;
  iterator iVar5;
  ulong uVar6;
  initializer_list<double> __l;
  allocator_type local_69;
  double local_68 [3];
  double local_50;
  double local_48;
  double local_40;
  
  local_68[2] = (double)amux;
  local_68[0] = 0.0;
  local_68[1] = 0.0;
  local_50 = (double)amun;
  local_48 = (double)amug;
  local_40 = (double)amuf;
  __l._M_len = 6;
  __l._M_array = local_68;
  std::vector<double,_std::allocator<double>_>::vector(__return_storage_ptr__,__l,&local_69);
  uVar6 = (long)(energies->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(energies->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start >> 3;
  lVar1 = (long)(d->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(d->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start;
  if ((((lVar1 >> 3 == (uVar6 & 0xffffffff)) &&
       ((long)(gx->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(gx->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start == lVar1)) &&
      ((long)(gn->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_finish -
       (long)(gn->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start == lVar1)) &&
     (((long)(gg->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_finish -
       (long)(gg->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start == lVar1 &&
      ((long)(gf->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_finish -
       (long)(gf->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start == lVar1)))) {
    if ((uint)uVar6 != 0) {
      lVar1 = 0;
      do {
        pdVar4 = (double *)
                 ((long)(energies->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_start + lVar1);
        iVar5._M_current =
             (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        pdVar2 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>).
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
        if (iVar5._M_current == pdVar2) {
          std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                    ((vector<double,std::allocator<double>> *)__return_storage_ptr__,iVar5,pdVar4);
          iVar5._M_current =
               (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl
               .super__Vector_impl_data._M_finish;
          pdVar2 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>).
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
        }
        else {
          *iVar5._M_current = *pdVar4;
          iVar5._M_current = iVar5._M_current + 1;
          (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_finish = iVar5._M_current;
        }
        pdVar4 = (double *)
                 ((long)(d->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_start + lVar1);
        if (iVar5._M_current == pdVar2) {
          std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                    ((vector<double,std::allocator<double>> *)__return_storage_ptr__,iVar5,pdVar4);
          iVar5._M_current =
               (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl
               .super__Vector_impl_data._M_finish;
          pdVar2 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>).
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
        }
        else {
          *iVar5._M_current = *pdVar4;
          iVar5._M_current = iVar5._M_current + 1;
          (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_finish = iVar5._M_current;
        }
        pdVar4 = (double *)
                 ((long)(gx->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_start + lVar1);
        if (iVar5._M_current == pdVar2) {
          std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                    ((vector<double,std::allocator<double>> *)__return_storage_ptr__,iVar5,pdVar4);
          iVar5._M_current =
               (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl
               .super__Vector_impl_data._M_finish;
          pdVar2 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>).
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
        }
        else {
          *iVar5._M_current = *pdVar4;
          iVar5._M_current = iVar5._M_current + 1;
          (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_finish = iVar5._M_current;
        }
        pdVar4 = (double *)
                 ((long)(gn->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_start + lVar1);
        if (iVar5._M_current == pdVar2) {
          std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                    ((vector<double,std::allocator<double>> *)__return_storage_ptr__,iVar5,pdVar4);
          iVar5._M_current =
               (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl
               .super__Vector_impl_data._M_finish;
          pdVar2 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>).
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
        }
        else {
          *iVar5._M_current = *pdVar4;
          iVar5._M_current = iVar5._M_current + 1;
          (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_finish = iVar5._M_current;
        }
        pdVar4 = (double *)
                 ((long)(gg->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_start + lVar1);
        if (iVar5._M_current == pdVar2) {
          std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                    ((vector<double,std::allocator<double>> *)__return_storage_ptr__,iVar5,pdVar4);
          iVar5._M_current =
               (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl
               .super__Vector_impl_data._M_finish;
          pdVar2 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>).
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
        }
        else {
          *iVar5._M_current = *pdVar4;
          iVar5._M_current = iVar5._M_current + 1;
          (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_finish = iVar5._M_current;
        }
        pdVar4 = (double *)
                 ((long)(gf->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_start + lVar1);
        if (iVar5._M_current == pdVar2) {
          std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                    ((vector<double,std::allocator<double>> *)__return_storage_ptr__,iVar5,pdVar4);
        }
        else {
          *iVar5._M_current = *pdVar4;
          (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_finish = iVar5._M_current + 1;
        }
        lVar1 = lVar1 + 8;
      } while ((uVar6 & 0xffffffff) << 3 != lVar1);
    }
    return __return_storage_ptr__;
  }
  tools::Log::info<char_const*>
            ("The number of energies and the resonance parameters are not consistent");
  tools::Log::info<char_const*,unsigned_int>("NE value: {}",(uint)uVar6);
  tools::Log::info<char_const*,unsigned_long>
            ("energies.size(): {}",
             (long)(energies->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(energies->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 3);
  tools::Log::info<char_const*,unsigned_long>
            ("d.size(): {}",
             (long)(d->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(d->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 3);
  tools::Log::info<char_const*,unsigned_long>
            ("gx.size(): {}",
             (long)(gx->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(gx->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 3);
  tools::Log::info<char_const*,unsigned_long>
            ("gn.size(): {}",
             (long)(gn->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(gn->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 3);
  tools::Log::info<char_const*,unsigned_long>
            ("gg.size(): {}",
             (long)(gg->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(gg->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 3);
  tools::Log::info<char_const*,unsigned_long>
            ("gf.size(): {}",
             (long)(gf->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(gf->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 3);
  puVar3 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar3 = getenv;
  __cxa_throw(puVar3,&std::exception::typeinfo,std::exception::~exception);
}

Assistant:

static std::vector< double >
generateList( int amux, int amun, int amug, int amuf,
              std::vector< double >&& energies,
              std::vector< double >&& d,
              std::vector< double >&& gx,
              std::vector< double >&& gn,
              std::vector< double >&& gg,
              std::vector< double >&& gf ) {

  std::vector< double > list{ 0.0, 0.0,
                              static_cast< double >( amux ),
                              static_cast< double >( amun ),
                              static_cast< double >( amug ),
                              static_cast< double >( amuf ) };

  unsigned int ne = energies.size();
  if ( ( d.size() != ne ) or ( gx.size() != ne ) or
       ( gn.size() != ne ) or ( gg.size() != ne ) or ( gf.size() != ne ) ) {

    Log::info( "The number of energies and the resonance parameters are not "
               "consistent" );
    Log::info( "NE value: {}", ne );
    Log::info( "energies.size(): {}", energies.size() );
    Log::info( "d.size(): {}", d.size() );
    Log::info( "gx.size(): {}", gx.size() );
    Log::info( "gn.size(): {}", gn.size() );
    Log::info( "gg.size(): {}", gg.size() );
    Log::info( "gf.size(): {}", gf.size() );
    throw std::exception();
  }

  for ( unsigned int i = 0; i < ne; ++i ) {

    list.push_back( energies[i] );
    list.push_back( d[i] );
    list.push_back( gx[i] );
    list.push_back( gn[i] );
    list.push_back( gg[i] );
    list.push_back( gf[i] );
  }
  return list;
}